

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> * __thiscall
dg::llvmdg::LazyLLVMCallGraph::getCallsOf
          (vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>
           *__return_storage_ptr__,LazyLLVMCallGraph *this,Function *F)

{
  pointer *pppCVar1;
  iterator __position;
  Use *use;
  Function *pFVar2;
  vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> *__x;
  Use *use_1;
  long lVar3;
  Function *pFVar4;
  CallInst *C;
  CallInst *local_48;
  Function *local_40;
  Function *local_38;
  
  pFVar2 = F;
  do {
    pFVar2 = *(Function **)(pFVar2 + 8);
    local_38 = F;
    if (pFVar2 == (Function *)0x0) goto LAB_00121268;
    lVar3 = *(long *)(pFVar2 + 0x18);
    if ((lVar3 == 0) || (*(char *)(lVar3 + 0x10) != 'S')) break;
    pFVar4 = *(Function **)(lVar3 + -0x20);
    if (pFVar4 == (Function *)0x0) {
      pFVar4 = (Function *)0x0;
    }
    else if (pFVar4[0x10] != (Function)0x0) {
      pFVar4 = (Function *)0x0;
    }
    if ((pFVar4 == (Function *)0x0) || (*(long *)(pFVar4 + 0x18) != *(long *)(lVar3 + 0x48))) {
      pFVar4 = (Function *)0x0;
    }
  } while (pFVar4 == F);
  if (pFVar2 == (Function *)0x0) {
LAB_00121268:
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar3 = *(long *)(F + 8);
    if (lVar3 != 0) {
      do {
        local_48 = *(CallInst **)(lVar3 + 0x18);
        local_40 = *(Function **)(*(long *)&(local_48->super_CallBase).field_0x28 + 0x38);
        GenericCallGraph<const_llvm::Function_*>::addCall(&this->_cg,&local_40,&local_38);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::CallInst_const*,std::allocator<llvm::CallInst_const*>>::
          _M_realloc_insert<llvm::CallInst_const*const&>
                    ((vector<llvm::CallInst_const*,std::allocator<llvm::CallInst_const*>> *)
                     __return_storage_ptr__,__position,&local_48);
        }
        else {
          *__position._M_current = local_48;
          pppCVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
        lVar3 = *(long *)(lVar3 + 8);
      } while (lVar3 != 0);
    }
  }
  else {
    __x = getCallsOfAddressTaken(this,F);
    std::vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>::vector
              (__return_storage_ptr__,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const llvm::CallInst *> getCallsOf(const llvm::Function *F) {
        if (funHasAddressTaken(F)) {
            return getCallsOfAddressTaken(F);
        }

        // has not address taken, so all users are calls
        std::vector<const llvm::CallInst *> ret;
        for (auto &use : F->uses()) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
            auto *user = *use;
#else
            auto *user = use.getUser();
#endif
            auto *C = llvm::cast<llvm::CallInst>(user);
            _cg.addCall(C->getParent()->getParent(), F);
            ret.push_back(C);
        }
        return ret;
    }